

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

uint __thiscall
wallet::CWallet::ComputeTimeSmart(CWallet *this,CWalletTx *wtx,bool rescanning_old_block)

{
  CWalletTx *pCVar1;
  bool bVar2;
  TxStateConfirmed *pTVar3;
  TxStateBlockConflicted *pTVar4;
  Chain *pCVar5;
  uint256 *puVar6;
  FoundBlock *pFVar7;
  ulong uVar8;
  pointer ppVar9;
  long *plVar10;
  long lVar11;
  byte in_DL;
  CWalletTx *in_RSI;
  ConstevalFormatString<3U> in_RDI;
  long in_FS_OFFSET;
  int64_t nSmartTime;
  CWalletTx *pwtx;
  TxItems *txOrdered;
  int64_t latestTolerated;
  uint nTimeSmart;
  TxStateBlockConflicted *conf_1;
  TxStateConfirmed *conf;
  const_reverse_iterator it;
  int64_t latestEntry;
  int64_t latestNow;
  int64_t block_max_time;
  int64_t blocktime;
  optional<uint256> block_hash;
  CWalletTx *in_stack_fffffffffffffe78;
  multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  char (*in_stack_fffffffffffffed0) [17];
  CWallet *in_stack_fffffffffffffed8;
  uint local_11c;
  uint local_d0;
  time_t local_c8;
  FoundBlock local_c0 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::optional<uint256>::optional((optional<uint256> *)in_stack_fffffffffffffe78);
  pTVar3 = CWalletTx::state<wallet::TxStateConfirmed>(in_stack_fffffffffffffe78);
  if (pTVar3 == (TxStateConfirmed *)0x0) {
    pTVar4 = CWalletTx::state<wallet::TxStateBlockConflicted>(in_stack_fffffffffffffe78);
    if (pTVar4 != (TxStateBlockConflicted *)0x0) {
      std::optional<uint256>::operator=
                ((optional<uint256> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (uint256 *)in_stack_fffffffffffffe80);
    }
  }
  else {
    std::optional<uint256>::operator=
              ((optional<uint256> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (uint256 *)in_stack_fffffffffffffe80);
  }
  local_11c = in_RSI->nTimeReceived;
  bVar2 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffffe78);
  if (bVar2) {
    pCVar5 = chain((CWallet *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    puVar6 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffffe78);
    memset(local_c0,0,0x50);
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffffe78);
    interfaces::FoundBlock::time(local_c0,&local_c8);
    pFVar7 = interfaces::FoundBlock::maxTime
                       ((FoundBlock *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (int64_t *)in_stack_fffffffffffffe80);
    uVar8 = (**(code **)(*(long *)pCVar5 + 0x50))(pCVar5,puVar6,pFVar7);
    if ((uVar8 & 1) == 0) {
      CWalletTx::GetHash(in_stack_fffffffffffffe78);
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffffe80);
      std::optional<uint256>::operator->((optional<uint256> *)in_stack_fffffffffffffe78);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe80);
      WalletLogPrintf<char[17],std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffed8,in_RDI,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe78);
    }
    else if ((in_DL & 1) == 0) {
      lVar11 = (ulong)in_RSI->nTimeReceived + 300;
      std::
      multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
      ::rbegin(in_stack_fffffffffffffe80);
      while( true ) {
        std::
        multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
        ::rend(in_stack_fffffffffffffe80);
        bVar2 = std::
                operator==<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                          ((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           (reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                            *)in_stack_fffffffffffffe80);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        ppVar9 = std::
                 reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                 ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                               *)in_stack_fffffffffffffe78);
        pCVar1 = ppVar9->second;
        if (pCVar1 != in_RSI) {
          uVar8 = (ulong)pCVar1->nTimeSmart;
          if (uVar8 == 0) {
            uVar8 = (ulong)pCVar1->nTimeReceived;
          }
          if ((long)uVar8 <= lVar11) break;
        }
        std::
        reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
        ::operator++((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                      *)in_stack_fffffffffffffe78);
      }
      std::min<long>((long *)in_stack_fffffffffffffe80,(long *)in_stack_fffffffffffffe78);
      plVar10 = std::max<long>((long *)in_stack_fffffffffffffe80,(long *)in_stack_fffffffffffffe78);
      local_11c = (uint)*plVar10;
    }
    else {
      local_11c = local_d0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11c;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CWallet::ComputeTimeSmart(const CWalletTx& wtx, bool rescanning_old_block) const
{
    std::optional<uint256> block_hash;
    if (auto* conf = wtx.state<TxStateConfirmed>()) {
        block_hash = conf->confirmed_block_hash;
    } else if (auto* conf = wtx.state<TxStateBlockConflicted>()) {
        block_hash = conf->conflicting_block_hash;
    }

    unsigned int nTimeSmart = wtx.nTimeReceived;
    if (block_hash) {
        int64_t blocktime;
        int64_t block_max_time;
        if (chain().findBlock(*block_hash, FoundBlock().time(blocktime).maxTime(block_max_time))) {
            if (rescanning_old_block) {
                nTimeSmart = block_max_time;
            } else {
                int64_t latestNow = wtx.nTimeReceived;
                int64_t latestEntry = 0;

                // Tolerate times up to the last timestamp in the wallet not more than 5 minutes into the future
                int64_t latestTolerated = latestNow + 300;
                const TxItems& txOrdered = wtxOrdered;
                for (auto it = txOrdered.rbegin(); it != txOrdered.rend(); ++it) {
                    CWalletTx* const pwtx = it->second;
                    if (pwtx == &wtx) {
                        continue;
                    }
                    int64_t nSmartTime;
                    nSmartTime = pwtx->nTimeSmart;
                    if (!nSmartTime) {
                        nSmartTime = pwtx->nTimeReceived;
                    }
                    if (nSmartTime <= latestTolerated) {
                        latestEntry = nSmartTime;
                        if (nSmartTime > latestNow) {
                            latestNow = nSmartTime;
                        }
                        break;
                    }
                }

                nTimeSmart = std::max(latestEntry, std::min(blocktime, latestNow));
            }
        } else {
            WalletLogPrintf("%s: found %s in block %s not in index\n", __func__, wtx.GetHash().ToString(), block_hash->ToString());
        }
    }
    return nTimeSmart;
}